

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkDarSeqSweep(Abc_Ntk_t *pNtk,Fra_Ssw_t *pPars)

{
  abctime aVar1;
  Abc_Ntk_t *pNtk_00;
  Aig_Man_t *pManAig;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar2;
  abctime aVar3;
  Abc_Obj_t *pLatch;
  int iVar4;
  Fraig_Params_t Params;
  
  aVar1 = Abc_Clock();
  Fraig_ParamsSetDefault(&Params);
  Params.nBTLimit = 100000;
  if ((pPars->fFraiging == 0) || (pPars->nPartSize != 0)) {
    pNtk_00 = Abc_NtkDup(pNtk);
  }
  else {
    pAVar2 = pNtk;
    pNtk_00 = Abc_NtkFraig(pNtk,&Params,0,0);
    iVar4 = (int)pAVar2;
    if (pPars->fVerbose != 0) {
      Abc_Print(iVar4,"%s =","Initial fraiging time");
      aVar3 = Abc_Clock();
      Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar1) / 1000000.0);
    }
  }
  pAVar2 = (Abc_Ntk_t *)0x0;
  pManAig = Abc_NtkToDar(pNtk_00,0,1);
  Abc_NtkDelete(pNtk_00);
  if (pManAig != (Aig_Man_t *)0x0) {
    pMan = Fra_FraigInduction(pManAig,pPars);
    Aig_ManStop(pManAig);
    if (pMan == (Aig_Man_t *)0x0) {
      pAVar2 = (Abc_Ntk_t *)0x0;
    }
    else {
      if (pMan->nRegs < pNtk->nObjCounts[8]) {
        pAVar2 = Abc_NtkFromDarSeqSweep(pNtk,pMan);
      }
      else {
        pAVar2 = Abc_NtkFromDar(pNtk,pMan);
        for (iVar4 = 0; iVar4 < pAVar2->vBoxes->nSize; iVar4 = iVar4 + 1) {
          pLatch = Abc_NtkBox(pAVar2,iVar4);
          if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
            Abc_LatchSetInit0(pLatch);
          }
        }
      }
      Aig_ManStop(pMan);
    }
  }
  return pAVar2;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarSeqSweep( Abc_Ntk_t * pNtk, Fra_Ssw_t * pPars )
{
    Fraig_Params_t Params;
    Abc_Ntk_t * pNtkAig = NULL, * pNtkFraig;
    Aig_Man_t * pMan, * pTemp;
    abctime clk = Abc_Clock();

    // preprocess the miter by fraiging it
    // (note that for each functional class, fraiging leaves one representative;
    // so fraiging does not reduce the number of functions represented by nodes
    Fraig_ParamsSetDefault( &Params );
    Params.nBTLimit = 100000;
    if ( pPars->fFraiging && pPars->nPartSize == 0 )
    {
        pNtkFraig = Abc_NtkFraig( pNtk, &Params, 0, 0 );
if ( pPars->fVerbose ) 
{
ABC_PRT( "Initial fraiging time", Abc_Clock() - clk );
}
    }
    else
        pNtkFraig = Abc_NtkDup( pNtk );

    pMan = Abc_NtkToDar( pNtkFraig, 0, 1 );
    Abc_NtkDelete( pNtkFraig );
    if ( pMan == NULL )
        return NULL;

//    pPars->TimeLimit = 5.0;
    pMan = Fra_FraigInduction( pTemp = pMan, pPars );
    Aig_ManStop( pTemp );
    if ( pMan )
    {
        if ( Aig_ManRegNum(pMan) < Abc_NtkLatchNum(pNtk) )
            pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
        else
        {
            Abc_Obj_t * pObj;
            int i;
            pNtkAig = Abc_NtkFromDar( pNtk, pMan );
            Abc_NtkForEachLatch( pNtkAig, pObj, i )
                Abc_LatchSetInit0( pObj );
        }
        Aig_ManStop( pMan );
    }
    return pNtkAig;
}